

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void * db_compact_during_doc_delete(void *args)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  fdb_file_info *__n;
  fdb_file_info *kvs_config;
  void *__s2;
  ulong uVar5;
  uint uVar6;
  char *unaff_RBP;
  char *pcVar7;
  fdb_file_info *info;
  char *ptr_fhandle;
  fdb_kvs_handle *handle;
  undefined1 handle_00 [8];
  fdb_kvs_handle *unaff_R12;
  long lVar8;
  __atomic_base<unsigned_long> unaff_R13;
  __atomic_base<unsigned_long> _Var9;
  filemgr *ptr_fhandle_00;
  fdb_config *pfVar10;
  ulong uVar11;
  __atomic_base<unsigned_long> *unaff_R15;
  timeval tVar12;
  timeval tVar13;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  pthread_t tid;
  void *thread_ret;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_14ae0;
  undefined1 auStack_14ad8 [16];
  undefined1 auStack_14ac8 [8];
  undefined1 auStack_14ac0 [80];
  ulong uStack_14a70;
  timeval tStack_14a50;
  fdb_file_info afStack_14a40 [3];
  fdb_file_info afStack_14940 [3];
  fdb_config fStack_14840;
  filemgr *pfStack_14748;
  fdb_kvs_handle *pfStack_14740;
  fdb_doc *pfStack_14738;
  fdb_config *pfStack_14730;
  __atomic_base<unsigned_long> *p_Stack_14728;
  code *pcStack_14720;
  fdb_file_handle *pfStack_14710;
  fdb_kvs_handle *pfStack_14708;
  timeval tStack_14700;
  undefined1 auStack_146ef [23];
  __atomic_base<unsigned_long> *p_Stack_146d8;
  timeval tStack_146d0;
  undefined1 auStack_146c0 [70];
  undefined1 uStack_1467a;
  undefined8 uStack_14670;
  filemgr *pfStack_145b0;
  fdb_kvs_handle *pfStack_145a8;
  fdb_doc *pfStack_145a0;
  filemgr *pfStack_14598;
  __atomic_base<unsigned_long> *p_Stack_14590;
  code *pcStack_14588;
  undefined1 auStack_14578 [8];
  undefined1 auStack_14570 [8];
  undefined1 auStack_14568 [8];
  __atomic_base<unsigned_long> _Stack_14560;
  undefined1 auStack_14558 [8];
  undefined1 auStack_14550 [16];
  fdb_kvs_config fStack_14540;
  atomic<unsigned_long> aStack_14528;
  __atomic_base<unsigned_long> _Stack_14520;
  __atomic_base<unsigned_long> _Stack_14518;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14510;
  undefined1 auStack_14508 [8];
  undefined1 auStack_14500 [16];
  undefined1 auStack_144f0 [16];
  atomic<unsigned_long> aStack_144e0;
  fdb_open_flags fStack_144cc;
  ushort uStack_144c2;
  atomic<unsigned_long> aStack_144b8;
  atomic<unsigned_long> aStack_14478;
  undefined1 auStack_143f8 [16];
  timeval tStack_143e8;
  undefined1 auStack_143d8 [328];
  char acStack_14290 [256];
  char acStack_14190 [256];
  fdb_kvs_handle afStack_14090 [153];
  fdb_kvs_handle *local_7c8;
  fdb_kvs_handle *local_7c0;
  __atomic_base<unsigned_long> local_7b8;
  void *local_7b0;
  fdb_kvs_config local_7a8;
  fdb_kvs_info local_790;
  timeval local_760;
  fdb_config local_750;
  char local_658 [256];
  char local_558 [256];
  char local_458 [256];
  fdb_doc *apfStack_358 [101];
  
  gettimeofday(&local_760,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_750.buffercache_size = 0;
  local_750.wal_threshold = 0x400;
  local_750.compaction_threshold = '\0';
  if (args == (void *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var9._M_i = (__int_type_conflict)&local_7c8;
    fVar1 = fdb_open((fdb_file_handle **)_Var9._M_i,"./compact_test1",&local_750);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      _Var9._M_i = (__int_type_conflict)local_7c8;
      fVar1 = fdb_kvs_open_default((fdb_file_handle *)local_7c8,&local_7c0,&local_7a8);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar8 = 0;
      uVar5 = 0;
      do {
        sprintf(local_458,"key%d",uVar5 & 0xffffffff);
        sprintf(local_558,"meta%d",uVar5 & 0xffffffff);
        sprintf(local_658,"body%d",uVar5 & 0xffffffff);
        unaff_R13._M_i = strlen(local_458);
        unaff_RBP = local_558;
        sVar3 = strlen(unaff_RBP);
        sVar4 = strlen(local_658);
        fdb_doc_create((fdb_doc **)((long)apfStack_358 + lVar8),local_458,unaff_R13._M_i,unaff_RBP,
                       sVar3,local_658,sVar4);
        fdb_set(local_7c0,apfStack_358[uVar5]);
        uVar5 = uVar5 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar5 != 100);
      fdb_commit((fdb_file_handle *)local_7c8,'\0');
      fdb_get_kvs_info(local_7c0,&local_790);
      if ((filemgr *)local_790.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar8 = 0;
      unaff_R15 = &local_7b8;
      do {
        fdb_del(local_7c0,apfStack_358[lVar8]);
        if (lVar8 == 0x32) {
          pthread_create(&unaff_R15->_M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         local_7c8);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 100);
      pthread_join(local_7b8._M_i,&local_7b0);
      fdb_commit((fdb_file_handle *)local_7c8,'\x01');
      fdb_get_kvs_info(local_7c0,&local_790);
      if ((filemgr *)local_790.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(local_7c0);
      _Var9._M_i = (__int_type_conflict)&local_7c8;
      fdb_close((fdb_file_handle *)local_7c8);
      fVar1 = fdb_open((fdb_file_handle **)_Var9._M_i,"./compact_test1",&local_750);
      unaff_R12 = (fdb_kvs_handle *)0x64;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var9._M_i = (__int_type_conflict)local_7c8;
      fVar1 = fdb_kvs_open_default((fdb_file_handle *)local_7c8,&local_7c0,&local_7a8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(local_7c0,&local_790);
        if ((filemgr *)local_790.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar8 = 0;
        do {
          fdb_doc_free(apfStack_358[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 100);
        fdb_kvs_close(local_7c0);
        fdb_close((fdb_file_handle *)local_7c8);
        fdb_shutdown();
        memleak_end();
        pcVar7 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar7 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar7,"multi thread client shutdown");
        return (void *)0x0;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var9._M_i = (__int_type_conflict)&local_7c8;
    fVar1 = fdb_open((fdb_file_handle **)_Var9._M_i,"./compact_test1",&local_750);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var9._M_i = (__int_type_conflict)local_7c8;
    fVar1 = fdb_compact((fdb_file_handle *)local_7c8,(char *)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)local_7c8);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle_00 = (filemgr *)0x0;
  pcStack_14588 = (code *)0x10fd83;
  auStack_14550._8_8_ = _Var9._M_i;
  gettimeofday(&tStack_143e8,(__timezone_ptr_t)0x0);
  pcStack_14588 = (code *)0x10fd88;
  memleak_start();
  pcStack_14588 = (code *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar7 = auStack_144f0;
  pcStack_14588 = (code *)0x10fda4;
  fdb_get_default_config();
  pcStack_14588 = (code *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_144f0._8_8_ = 0;
  aStack_144e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_144cc = 1;
  uStack_144c2 = 0x1e01;
  aStack_144b8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  aStack_14478.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x10fde7;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)pcVar7);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_001108c3;
  aStack_14478.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
  pcStack_14588 = (code *)0x10fe14;
  fdb_open((fdb_file_handle **)auStack_14578,"compact_test",(fdb_config *)auStack_144f0);
  pcVar7 = auStack_14570;
  pcStack_14588 = (code *)0x10fe29;
  fdb_kvs_open_default((fdb_file_handle *)auStack_14578,(fdb_kvs_handle **)pcVar7,&fStack_14540);
  pcStack_14588 = (code *)0x10fe3f;
  ptr_fhandle = (char *)auStack_14570;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14570,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
  pcStack_14588 = (code *)0x10fe53;
  puts("Initialize..");
  unaff_R13._M_i = 0;
  uVar5 = 0;
  do {
    pcStack_14588 = (code *)0x10fe75;
    sprintf(auStack_143d8 + 0x48,"key%04d",uVar5 & 0xffffffff);
    pcStack_14588 = (code *)0x10fe8e;
    sprintf(acStack_14190,"meta%04d",uVar5 & 0xffffffff);
    pcStack_14588 = (code *)0x10fea7;
    sprintf(acStack_14290,"body%04d",uVar5 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(&afStack_14090[0].kvs_config.create_if_missing + unaff_R13._M_i);
    pcStack_14588 = (code *)0x10feba;
    sVar3 = strlen(auStack_143d8 + 0x48);
    unaff_RBP = (char *)(sVar3 + 1);
    pcStack_14588 = (code *)0x10fece;
    sVar3 = strlen(acStack_14190);
    unaff_R15 = (__atomic_base<unsigned_long> *)(sVar3 + 1);
    pcStack_14588 = (code *)0x10fedf;
    sVar3 = strlen(acStack_14290);
    pcStack_14588 = (code *)0x10ff07;
    fdb_doc_create((fdb_doc **)unaff_R12,auStack_143d8 + 0x48,(size_t)unaff_RBP,acStack_14190,
                   (size_t)unaff_R15,acStack_14290,sVar3 + 1);
    pcStack_14588 = (code *)0x10ff19;
    fdb_set((fdb_kvs_handle *)auStack_14570,
            *(fdb_doc **)(&afStack_14090[0].kvs_config.create_if_missing + uVar5 * 8));
    uVar5 = uVar5 + 1;
    unaff_R13._M_i = unaff_R13._M_i + 8;
  } while (uVar5 != 10000);
  pcVar7 = auStack_14578;
  pcStack_14588 = (code *)0x10ff3c;
  fdb_commit((fdb_file_handle *)auStack_14578,'\0');
  pcStack_14588 = (code *)0x10ff44;
  fdb_close((fdb_file_handle *)auStack_14578);
  pcStack_14588 = (code *)0x10ff5b;
  ptr_fhandle = pcVar7;
  fVar1 = fdb_open((fdb_file_handle **)pcVar7,"compact_test",(fdb_config *)auStack_144f0);
  ptr_fhandle_00 = (filemgr *)0x2710;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
  pcStack_14588 = (code *)0x10ff77;
  ptr_fhandle = (char *)auStack_14578;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14578,(fdb_kvs_handle **)auStack_14570,&fStack_14540
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
  pcStack_14588 = (code *)0x10ff97;
  ptr_fhandle = (char *)auStack_14570;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14570,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
  pcVar7 = auStack_143d8;
  pcStack_14588 = (code *)0x10ffb4;
  fdb_get_file_info((fdb_file_handle *)auStack_14578,(fdb_file_info *)pcVar7);
  pcStack_14588 = (code *)0x10ffc3;
  iVar2 = strcmp((char *)auStack_143d8._0_8_,"compact_test");
  if (iVar2 != 0) {
    pcStack_14588 = (code *)0x10ffd4;
    compaction_daemon_test();
  }
  ptr_fhandle_00 = (filemgr *)(auStack_143d8 + 0x48);
  unaff_R15 = &_Stack_14560;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  _Var9._M_i = unaff_R13._M_i;
  do {
    pcStack_14588 = (code *)0x10fff8;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pcStack_14588 = (code *)0x110000;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pcStack_14588 = (code *)0x11001f;
    fdb_doc_create((fdb_doc **)unaff_R15,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pcStack_14588 = (code *)0x11002e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14570,(fdb_doc *)_Stack_14560._M_i);
    unaff_R13._M_i = _Stack_14560._M_i;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
      pcStack_14588 = (code *)0x1108a3;
      compaction_daemon_test();
      goto LAB_001108a3;
    }
    unaff_RBP = *(char **)(_Stack_14560._M_i + 0x40);
    pcVar7 = *(char **)(*(long *)(&afStack_14090[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pcStack_14588 = (code *)0x11005a;
    iVar2 = bcmp(unaff_RBP,pcVar7,*(size_t *)(_Stack_14560._M_i + 0x10));
    _Var9._M_i = unaff_R13._M_i;
    if (iVar2 != 0) {
      pcStack_14588 = (code *)0x11089e;
      compaction_daemon_test();
      goto LAB_0011089e;
    }
    pcStack_14588 = (code *)0x11006a;
    fdb_doc_free((fdb_doc *)unaff_R13._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcStack_14588 = (code *)0x11008e;
  ptr_fhandle = (char *)auStack_14570;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)auStack_14570,(fdb_kvs_handle **)&aStack_14528,10000);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
  pcStack_14588 = (code *)0x1100a0;
  fdb_kvs_close((fdb_kvs_handle *)aStack_14528.super___atomic_base<unsigned_long>._M_i);
  pcVar7 = auStack_14578;
  pcStack_14588 = (code *)0x1100ad;
  fdb_close((fdb_file_handle *)auStack_14578);
  pcStack_14588 = (code *)0x1100b9;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pcStack_14588 = (code *)0x1100d0;
  ptr_fhandle = pcVar7;
  fVar1 = fdb_open((fdb_file_handle **)pcVar7,"compact_test",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
  pcStack_14588 = (code *)0x1100ec;
  ptr_fhandle = (char *)auStack_14578;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14578,(fdb_kvs_handle **)auStack_14570,&fStack_14540
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
  pcStack_14588 = (code *)0x11010c;
  ptr_fhandle = (char *)auStack_14570;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14570,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
  ptr_fhandle_00 = (filemgr *)(auStack_143d8 + 0x48);
  unaff_R15 = &_Stack_14560;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_14588 = (code *)0x110138;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pcStack_14588 = (code *)0x110140;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pcStack_14588 = (code *)0x11015f;
    fdb_doc_create((fdb_doc **)unaff_R15,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pcStack_14588 = (code *)0x11016e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14570,(fdb_doc *)_Stack_14560._M_i);
    _Var9._M_i = _Stack_14560._M_i;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
    unaff_RBP = *(char **)(_Stack_14560._M_i + 0x40);
    pcVar7 = *(char **)(*(long *)(&afStack_14090[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pcStack_14588 = (code *)0x11019a;
    iVar2 = bcmp(unaff_RBP,pcVar7,*(size_t *)(_Stack_14560._M_i + 0x10));
    if (iVar2 != 0) goto LAB_001108a3;
    pcStack_14588 = (code *)0x1101aa;
    fdb_doc_free((fdb_doc *)_Var9._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var9._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcVar7 = auStack_14578;
  pcStack_14588 = (code *)0x1101c7;
  fdb_close((fdb_file_handle *)auStack_14578);
  pcStack_14588 = (code *)0x1101d3;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pcStack_14588 = (code *)0x1101ea;
  ptr_fhandle = pcVar7;
  fVar1 = fdb_open((fdb_file_handle **)pcVar7,"compact_test",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
  pcStack_14588 = (code *)0x110206;
  ptr_fhandle = (char *)auStack_14578;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14578,(fdb_kvs_handle **)auStack_14570,&fStack_14540
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
  pcStack_14588 = (code *)0x110226;
  ptr_fhandle = (char *)auStack_14570;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14570,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
  ptr_fhandle_00 = (filemgr *)(auStack_143d8 + 0x48);
  unaff_R15 = &_Stack_14560;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_14588 = (code *)0x110252;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pcStack_14588 = (code *)0x11025a;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pcStack_14588 = (code *)0x110279;
    fdb_doc_create((fdb_doc **)unaff_R15,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pcStack_14588 = (code *)0x110288;
    ptr_fhandle = (char *)auStack_14570;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14570,(fdb_doc *)_Stack_14560._M_i);
    _Var9._M_i = _Stack_14560._M_i;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108be;
    unaff_RBP = *(char **)(_Stack_14560._M_i + 0x40);
    pcVar7 = *(char **)(*(long *)(&afStack_14090[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pcStack_14588 = (code *)0x1102b4;
    iVar2 = bcmp(unaff_RBP,pcVar7,*(size_t *)(_Stack_14560._M_i + 0x10));
    if (iVar2 != 0) goto LAB_001108b3;
    pcStack_14588 = (code *)0x1102c4;
    fdb_doc_free((fdb_doc *)_Var9._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var9._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcStack_14588 = (code *)0x1102de;
  fdb_close((fdb_file_handle *)auStack_14578);
  ptr_fhandle = auStack_14550;
  pcStack_14588 = (code *)0x1102f7;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_less",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
  pcStack_14588 = (code *)0x110313;
  ptr_fhandle = (char *)auStack_14550._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14550._0_8_,(fdb_kvs_handle **)&aStack_14510.seqtree
                     ,&fStack_14540);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110904;
  uStack_144c2 = uStack_144c2 & 0xff;
  ptr_fhandle = auStack_14558;
  pcStack_14588 = (code *)0x110338;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110909;
  pcStack_14588 = (code *)0x110354;
  ptr_fhandle = (char *)auStack_14558;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14558,(fdb_kvs_handle **)&_Stack_14518,&fStack_14540
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
  uStack_144c2 = uStack_144c2 & 0xff00;
  ptr_fhandle = auStack_14568;
  pcStack_14588 = (code *)0x110379;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual",(fdb_config *)auStack_144f0
                  );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110913;
  pcStack_14588 = (code *)0x110395;
  ptr_fhandle = (char *)auStack_14568;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14568,(fdb_kvs_handle **)&_Stack_14520,&fStack_14540
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110918;
  uStack_144c2 = 0x1e01;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x1103bc;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
  pcStack_14588 = (code *)0x1103d8;
  ptr_fhandle = (char *)auStack_14578;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14578,(fdb_kvs_handle **)auStack_14570,&fStack_14540
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110922;
  pcStack_14588 = (code *)0x1103f8;
  ptr_fhandle = (char *)auStack_14570;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14570,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110927;
  _Var9._M_i = 0;
  pcStack_14588 = (code *)0x110416;
  printf("wait for %d seconds..\n");
  pcVar7 = auStack_143f8;
  pcStack_14588 = (code *)0x110428;
  gettimeofday((timeval *)pcVar7,(__timezone_ptr_t)0x0);
  tVar13.tv_usec = auStack_143f8._8_8_;
  tVar13.tv_sec = auStack_143f8._0_8_;
  unaff_R12 = (fdb_kvs_handle *)auStack_14500;
  while( true ) {
    pcStack_14588 = (code *)0x110449;
    fdb_set((fdb_kvs_handle *)auStack_14570,
            *(fdb_doc **)(&afStack_14090[0].kvs_config.create_if_missing + _Var9._M_i * 8));
    pcStack_14588 = (code *)0x110455;
    fdb_commit((fdb_file_handle *)auStack_14578,'\0');
    if ((ushort)((ushort)((short)_Var9._M_i * 0x5c29) >> 2 | (short)_Var9._M_i * 0x4000) < 0x290) {
      pcStack_14588 = (code *)0x11047c;
      fdb_set((fdb_kvs_handle *)aStack_14510.seqtree,
              *(fdb_doc **)(&afStack_14090[0].kvs_config.create_if_missing + _Var9._M_i * 8));
      pcStack_14588 = (code *)0x110488;
      fdb_commit((fdb_file_handle *)auStack_14550._0_8_,'\0');
    }
    pcStack_14588 = (code *)0x11049a;
    fdb_set((fdb_kvs_handle *)_Stack_14518._M_i,
            *(fdb_doc **)(&afStack_14090[0].kvs_config.create_if_missing + _Var9._M_i * 8));
    pcStack_14588 = (code *)0x1104a6;
    fdb_commit((fdb_file_handle *)auStack_14558,'\0');
    pcStack_14588 = (code *)0x1104b8;
    fdb_set((fdb_kvs_handle *)_Stack_14520._M_i,
            *(fdb_doc **)(&afStack_14090[0].kvs_config.create_if_missing + _Var9._M_i * 8));
    pcStack_14588 = (code *)0x1104c4;
    fdb_commit((fdb_file_handle *)auStack_14568,'\0');
    pcStack_14588 = (code *)0x1104ce;
    gettimeofday((timeval *)unaff_R12,(__timezone_ptr_t)0x0);
    pcStack_14588 = (code *)0x1104e9;
    tVar12 = _utime_gap(tVar13,(timeval)auStack_14500);
    if ((ulong)auStack_14550._8_8_ <= (fdb_kvs_handle *)tVar12.tv_sec) break;
    _Var9._M_i = (long)&((fdb_doc *)_Var9._M_i)->keylen + 1;
    if ((fdb_doc *)_Var9._M_i == (fdb_doc *)0x2710) {
      _Var9._M_i = 0;
    }
  }
  pcStack_14588 = (code *)0x110517;
  ptr_fhandle = (char *)auStack_14578;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14578,0x3c);
  ptr_fhandle_00 = (filemgr *)auStack_143f8._0_8_;
  unaff_R15 = (__atomic_base<unsigned_long> *)auStack_143f8._8_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
  pcStack_14588 = (code *)0x11052e;
  ptr_fhandle = (char *)auStack_14578;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14578,1);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110931;
  pcStack_14588 = (code *)0x110542;
  ptr_fhandle = (char *)auStack_14558;
  fVar1 = fdb_compact((fdb_file_handle *)auStack_14558,(char *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110936;
  pcStack_14588 = (code *)0x11055b;
  ptr_fhandle = (char *)auStack_14568;
  fVar1 = fdb_compact((fdb_file_handle *)auStack_14568,"compact_test_manual_compacted");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
  uStack_144c2 = uStack_144c2 & 0xff00;
  ptr_fhandle = auStack_14508;
  pcStack_14588 = (code *)0x110580;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110940;
  pcStack_14588 = (code *)0x11059c;
  ptr_fhandle = (char *)auStack_14568;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14568,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
  pcStack_14588 = (code *)0x1105af;
  fVar1 = fdb_close((fdb_file_handle *)auStack_14508);
  ptr_fhandle = (char *)auStack_14508;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
  pcStack_14588 = (code *)0x1105cb;
  ptr_fhandle = (char *)auStack_14568;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14568,'\x01',10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
  pcStack_14588 = (code *)0x1105e7;
  ptr_fhandle = (char *)auStack_14568;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14568,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110954;
  pcStack_14588 = (code *)0x1105f9;
  ptr_fhandle = (char *)auStack_14568;
  fVar1 = fdb_close((fdb_file_handle *)auStack_14568);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110959;
  uStack_144c2 = CONCAT11(uStack_144c2._1_1_,1);
  ptr_fhandle = auStack_14568;
  pcStack_14588 = (code *)0x11061e;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
  pcStack_14588 = (code *)0x110634;
  ptr_fhandle = (char *)auStack_14558;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14558,'\0',0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110963;
  pcStack_14588 = (code *)0x110646;
  ptr_fhandle = (char *)auStack_14558;
  fVar1 = fdb_close((fdb_file_handle *)auStack_14558);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110968;
  uStack_144c2 = uStack_144c2 & 0xff00;
  ptr_fhandle = auStack_14558;
  pcStack_14588 = (code *)0x11066b;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
  pcVar7 = "compact_test_non.manual";
  pcStack_14588 = (code *)0x110687;
  fdb_compact((fdb_file_handle *)auStack_14558,"compact_test_non.manual");
  ptr_fhandle_00 = (filemgr *)auStack_14578;
  pcStack_14588 = (code *)0x110694;
  fdb_close((fdb_file_handle *)auStack_14578);
  pcStack_14588 = (code *)0x11069e;
  fdb_close((fdb_file_handle *)auStack_14550._0_8_);
  pcStack_14588 = (code *)0x1106a8;
  fdb_close((fdb_file_handle *)auStack_14568);
  uStack_144c2 = CONCAT11(uStack_144c2._1_1_,1);
  pcStack_14588 = (code *)0x1106bf;
  ptr_fhandle = (char *)ptr_fhandle_00;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle_00,"compact_test_non.manual",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
  ptr_fhandle = "compact_test_non.manual";
  pcStack_14588 = (code *)0x1106dc;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
  uStack_144c2 = uStack_144c2 & 0xff00;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x110702;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
  ptr_fhandle = "compact_test_manual_compacted";
  pcStack_14588 = (code *)0x11071f;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
  uStack_144c2 = CONCAT11(uStack_144c2._1_1_,1);
  ptr_fhandle = "compact_test_manual_compacted";
  pcStack_14588 = (code *)0x110740;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110986;
  uStack_144c2 = uStack_144c2 & 0xff00;
  ptr_fhandle = "compact_test_non.manual";
  pcStack_14588 = (code *)0x110760;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
  pcStack_14588 = (code *)0x110773;
  fdb_close((fdb_file_handle *)auStack_14558);
  pcStack_14588 = (code *)0x110778;
  fVar1 = fdb_shutdown();
  ptr_fhandle = (char *)auStack_14558;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110990;
  ptr_fhandle = "compact_test_non.manual";
  pcStack_14588 = (code *)0x110794;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110995;
  fStack_144cc = 2;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x1107bc;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x1107de;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x110800;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
  ptr_fhandle = auStack_14578;
  pcStack_14588 = (code *)0x110822;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                   (fdb_config *)auStack_144f0);
  if (fVar1 == FDB_RESULT_NO_SUCH_FILE) {
    lVar8 = 0;
    do {
      pcStack_14588 = (code *)0x11083a;
      fdb_doc_free(*(fdb_doc **)(&afStack_14090[0].kvs_config.create_if_missing + lVar8 * 8));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 10000);
    pcStack_14588 = (code *)0x11084b;
    fdb_shutdown();
    pcStack_14588 = (code *)0x110850;
    memleak_end();
    pcVar7 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar7 = "%s FAILED\n";
    }
    pcStack_14588 = (code *)0x110881;
    iVar2 = fprintf(_stderr,pcVar7,"compaction daemon test");
    return (void *)CONCAT44(extraout_var,iVar2);
  }
  goto LAB_001109a9;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_001108a3:
  pcStack_14588 = (code *)0x1108ae;
  compaction_daemon_test();
  unaff_R13._M_i = _Var9._M_i;
LAB_001108ae:
  _Var9._M_i = unaff_R13._M_i;
  pcStack_14588 = (code *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pcStack_14588 = (code *)0x1108be;
  ptr_fhandle = pcVar7;
  compaction_daemon_test();
  unaff_R13._M_i = _Var9._M_i;
LAB_001108be:
  unaff_R15 = &_Stack_14560;
  ptr_fhandle_00 = (filemgr *)(auStack_143d8 + 0x48);
  pcStack_14588 = (code *)0x1108c3;
  compaction_daemon_test();
LAB_001108c3:
  pcStack_14588 = (code *)0x1108c8;
  compaction_daemon_test();
LAB_001108c8:
  pcStack_14588 = (code *)0x1108cd;
  compaction_daemon_test();
LAB_001108cd:
  pcStack_14588 = (code *)0x1108d2;
  compaction_daemon_test();
LAB_001108d2:
  pcStack_14588 = (code *)0x1108d7;
  compaction_daemon_test();
LAB_001108d7:
  pcStack_14588 = (code *)0x1108dc;
  compaction_daemon_test();
LAB_001108dc:
  pcStack_14588 = (code *)0x1108e1;
  compaction_daemon_test();
LAB_001108e1:
  pcStack_14588 = (code *)0x1108e6;
  compaction_daemon_test();
LAB_001108e6:
  pcStack_14588 = (code *)0x1108eb;
  compaction_daemon_test();
  _Var9._M_i = unaff_R13._M_i;
LAB_001108eb:
  pcStack_14588 = (code *)0x1108f0;
  compaction_daemon_test();
LAB_001108f0:
  pcStack_14588 = (code *)0x1108f5;
  compaction_daemon_test();
LAB_001108f5:
  pcStack_14588 = (code *)0x1108fa;
  compaction_daemon_test();
LAB_001108fa:
  pcStack_14588 = (code *)0x1108ff;
  compaction_daemon_test();
LAB_001108ff:
  pcStack_14588 = (code *)0x110904;
  compaction_daemon_test();
LAB_00110904:
  pcStack_14588 = (code *)0x110909;
  compaction_daemon_test();
LAB_00110909:
  pcStack_14588 = (code *)0x11090e;
  compaction_daemon_test();
LAB_0011090e:
  pcStack_14588 = (code *)0x110913;
  compaction_daemon_test();
LAB_00110913:
  pcStack_14588 = (code *)0x110918;
  compaction_daemon_test();
LAB_00110918:
  pcStack_14588 = (code *)0x11091d;
  compaction_daemon_test();
LAB_0011091d:
  pcStack_14588 = (code *)0x110922;
  compaction_daemon_test();
LAB_00110922:
  pcStack_14588 = (code *)0x110927;
  compaction_daemon_test();
LAB_00110927:
  pcStack_14588 = (code *)0x11092c;
  compaction_daemon_test();
LAB_0011092c:
  pcStack_14588 = (code *)0x110931;
  compaction_daemon_test();
LAB_00110931:
  pcStack_14588 = (code *)0x110936;
  compaction_daemon_test();
LAB_00110936:
  pcStack_14588 = (code *)0x11093b;
  compaction_daemon_test();
LAB_0011093b:
  pcStack_14588 = (code *)0x110940;
  compaction_daemon_test();
LAB_00110940:
  pcStack_14588 = (code *)0x110945;
  compaction_daemon_test();
LAB_00110945:
  pcStack_14588 = (code *)0x11094a;
  compaction_daemon_test();
LAB_0011094a:
  pcStack_14588 = (code *)0x11094f;
  compaction_daemon_test();
LAB_0011094f:
  pcStack_14588 = (code *)0x110954;
  compaction_daemon_test();
LAB_00110954:
  pcStack_14588 = (code *)0x110959;
  compaction_daemon_test();
LAB_00110959:
  pcStack_14588 = (code *)0x11095e;
  compaction_daemon_test();
LAB_0011095e:
  pcStack_14588 = (code *)0x110963;
  compaction_daemon_test();
LAB_00110963:
  pcStack_14588 = (code *)0x110968;
  compaction_daemon_test();
LAB_00110968:
  pcStack_14588 = (code *)0x11096d;
  compaction_daemon_test();
LAB_0011096d:
  pcStack_14588 = (code *)0x110972;
  compaction_daemon_test();
LAB_00110972:
  pcStack_14588 = (code *)0x110977;
  compaction_daemon_test();
LAB_00110977:
  pcStack_14588 = (code *)0x11097c;
  compaction_daemon_test();
LAB_0011097c:
  pcStack_14588 = (code *)0x110981;
  compaction_daemon_test();
LAB_00110981:
  pcStack_14588 = (code *)0x110986;
  compaction_daemon_test();
LAB_00110986:
  pcStack_14588 = (code *)0x11098b;
  compaction_daemon_test();
LAB_0011098b:
  pcStack_14588 = (code *)0x110990;
  compaction_daemon_test();
LAB_00110990:
  pcStack_14588 = (code *)0x110995;
  compaction_daemon_test();
LAB_00110995:
  pcStack_14588 = (code *)0x11099a;
  compaction_daemon_test();
LAB_0011099a:
  pcStack_14588 = (code *)0x11099f;
  compaction_daemon_test();
LAB_0011099f:
  pcStack_14588 = (code *)0x1109a4;
  compaction_daemon_test();
LAB_001109a4:
  pcStack_14588 = (code *)0x1109a9;
  compaction_daemon_test();
LAB_001109a9:
  pcStack_14588 = auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pcStack_14720 = (code *)0x1109ce;
  pfStack_145b0 = (filemgr *)pcVar7;
  pfStack_145a8 = unaff_R12;
  pfStack_145a0 = (fdb_doc *)_Var9._M_i;
  pfStack_14598 = ptr_fhandle_00;
  p_Stack_14590 = unaff_R15;
  pcStack_14588 = (code *)unaff_RBP;
  gettimeofday(&tStack_146d0,(__timezone_ptr_t)0x0);
  pcStack_14720 = (code *)0x1109d3;
  memleak_start();
  pcStack_14720 = (code *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_14720 = (code *)0x1109ec;
  fdb_get_default_config();
  uStack_1467a = 1;
  uStack_14670._0_2_ = 1;
  uStack_14670._2_2_ = 0;
  uStack_14670._4_4_ = 0;
  pcStack_14720 = (code *)0x110a0d;
  fVar1 = fdb_open(&pfStack_14710,"compact_test",(fdb_config *)(auStack_146c0 + 0x18));
  pfVar10 = (fdb_config *)(auStack_146c0 + 0x18);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar10 = (fdb_config *)auStack_146c0;
    pcStack_14720 = (code *)0x110a22;
    fdb_get_default_kvs_config();
    pcStack_14720 = (code *)0x110a34;
    fVar1 = fdb_kvs_open_default(pfStack_14710,&pfStack_14708,(fdb_kvs_config *)pfVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pcStack_14720 = (code *)0x110a4b;
    gettimeofday((timeval *)(auStack_146ef + 0xf),(__timezone_ptr_t)0x0);
    pcStack_14720 = (code *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)ptr_fhandle & 0xffffffff);
    tVar12.tv_usec = (__suseconds_t)p_Stack_146d8;
    tVar12.tv_sec = auStack_146ef._15_8_;
    _Var9._M_i = (__int_type_conflict)auStack_146ef;
    unaff_RBP = (char *)0x0;
    do {
      iVar2 = (int)unaff_RBP;
      pcStack_14720 = (code *)0x110a7c;
      sprintf((char *)_Var9._M_i,"%d",unaff_RBP);
      unaff_R12 = pfStack_14708;
      pcStack_14720 = (code *)0x110a89;
      sVar3 = strlen((char *)_Var9._M_i);
      pcStack_14720 = (code *)0x110aa4;
      fVar1 = fdb_set_kv(unaff_R12,(void *)_Var9._M_i,sVar3,"value",5);
      pfVar10 = (fdb_config *)auStack_146ef._15_8_;
      unaff_R15 = p_Stack_146d8;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pcStack_14720 = (code *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pcStack_14720 = (code *)0x110ab8;
      fVar1 = fdb_commit(pfStack_14710,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_14720 = (code *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pcStack_14720 = (code *)0x110acc;
      gettimeofday((timeval *)&tStack_14700,(__timezone_ptr_t)0x0);
      pcStack_14720 = (code *)0x110ae1;
      tVar13 = _utime_gap(tVar12,tStack_14700);
    } while (((filemgr *)tVar13.tv_sec < ptr_fhandle) &&
            (unaff_RBP = (char *)(ulong)(iVar2 + 1), iVar2 != 99999));
    pcStack_14720 = (code *)0x110b01;
    fVar1 = fdb_close(pfStack_14710);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pcStack_14720 = (code *)0x110b0a;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_14720 = (code *)0x110b13;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pcStack_14720 = (code *)0x110b44;
      iVar2 = fprintf(_stderr,pcVar7,"auto compaction with concurrent insert test");
      return (void *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else {
LAB_00110b60:
    pcStack_14720 = (code *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pcStack_14720 = (code *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pcStack_14720 = (code *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pcStack_14720 = auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_14748 = (filemgr *)ptr_fhandle;
  pfStack_14740 = unaff_R12;
  pfStack_14738 = (fdb_doc *)_Var9._M_i;
  pfStack_14730 = pfVar10;
  p_Stack_14728 = unaff_R15;
  pcStack_14720 = (code *)unaff_RBP;
  gettimeofday(&tStack_14a50,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_14ac0._32_8_ = (btree *)0x0;
  auStack_14ac0._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_14840.wal_threshold = 0x1000;
  fStack_14840.compaction_mode = '\x01';
  fStack_14840.compaction_threshold = '\n';
  fStack_14840.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  handle = (fdb_kvs_handle *)&pfStack_14ae0;
  kvs_config = (fdb_file_info *)0x1;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)handle,"compact_test",&fStack_14840,1,
                              (char **)(auStack_14ac0 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_14ac0 + 0x18),(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_14ac0._16_8_ = afStack_14a40[0].doc_count;
    auStack_14ac0._0_8_ = afStack_14a40[0].filename;
    auStack_14ac0._8_8_ = afStack_14a40[0].new_filename;
    info = (fdb_file_info *)auStack_14ad8;
    handle = pfStack_14ae0;
    fVar1 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_14ae0,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_14ac0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_14ac8;
    kvs_config = (fdb_file_info *)auStack_14ac0;
    handle = pfStack_14ae0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14ae0,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar5 = 0;
    do {
      sprintf((char *)afStack_14a40,"key%06d",uVar5);
      sprintf((char *)afStack_14940,"body%06d",uVar5);
      handle = (fdb_kvs_handle *)auStack_14ad8._0_8_;
      sVar3 = strlen((char *)afStack_14a40);
      sVar4 = strlen((char *)afStack_14940);
      kvs_config = afStack_14940;
      info = afStack_14a40;
      fVar1 = fdb_set_kv(handle,afStack_14a40,sVar3,afStack_14940,sVar4);
      handle_00 = auStack_14ac8;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar3 = strlen((char *)afStack_14a40);
      sVar4 = strlen((char *)afStack_14940);
      kvs_config = afStack_14940;
      info = afStack_14a40;
      fVar1 = fdb_set_kv((fdb_kvs_handle *)handle_00,afStack_14a40,sVar3,afStack_14940,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        handle = (fdb_kvs_handle *)handle_00;
        goto LAB_00110f53;
      }
      uVar6 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar6;
    } while (uVar6 != 10000);
    kvs_config = (fdb_file_info *)auStack_14ac0;
    auStack_14ac0._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_14ad8 + 8);
    handle = pfStack_14ae0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14ae0,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_14a40;
    sprintf((char *)info,"key%06d",0);
    kvs_config = afStack_14940;
    sprintf((char *)kvs_config,"body%06d",0);
    sVar3 = strlen((char *)info);
    sVar4 = strlen((char *)kvs_config);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)auStack_14ad8._8_8_,info,sVar3,kvs_config,sVar4);
    handle = (fdb_kvs_handle *)auStack_14ad8._8_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    handle = pfStack_14ae0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14ae0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar5 = 0;
    uVar11 = 0;
    do {
      sprintf((char *)afStack_14a40,"key%06d",uVar11);
      sprintf((char *)afStack_14940,"body%06d",uVar11);
      handle = (fdb_kvs_handle *)auStack_14ad8._0_8_;
      sVar3 = strlen((char *)afStack_14a40);
      sVar4 = strlen((char *)afStack_14940);
      kvs_config = afStack_14940;
      info = afStack_14a40;
      fVar1 = fdb_set_kv(handle,afStack_14a40,sVar3,afStack_14940,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_14ac0 + 0x28);
      handle = pfStack_14ae0;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14ae0,info);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar5 < uStack_14a70) {
        uVar5 = uStack_14a70;
      }
      uVar6 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar6;
    } while (uVar6 != 10000);
    info = (fdb_file_info *)0x0;
    handle = pfStack_14ae0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14ae0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_14ac0 + 0x28);
    handle = pfStack_14ae0;
    fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14ae0,info);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar5 < uStack_14a70) {
      uVar5 = uStack_14a70;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar5);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_14ac0 + 0x28);
      handle = pfStack_14ae0;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14ae0,
                                (fdb_file_info *)(auStack_14ac0 + 0x28));
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar5 <= uStack_14a70);
    fVar1 = fdb_close((fdb_file_handle *)pfStack_14ae0);
    handle = pfStack_14ae0;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      handle = pfStack_14ae0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar7 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar7 = "%s FAILED\n";
        }
        iVar2 = fprintf(_stderr,pcVar7,"auto compaction with custom comparison function");
        return (void *)CONCAT44(extraout_var_01,iVar2);
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info != kvs_config) {
    __n = kvs_config;
    if (info < kvs_config) {
      __n = info;
    }
    uVar6 = memcmp(handle,__s2,(size_t)__n);
    if (uVar6 == 0) {
      uVar6 = (int)info - (int)kvs_config;
    }
    return (void *)(ulong)uVar6;
  }
  iVar2 = memcmp(handle,__s2,(size_t)info);
  return (void *)CONCAT44(extraout_var_02,iVar2);
}

Assistant:

void *db_compact_during_doc_delete(void *args)
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    thread_t tid;
    void *thread_ret;
    fdb_doc **doc = alca(fdb_doc*, n);
    char keybuf[256], metabuf[256], bodybuf[256];

    // init dbfile
    kvs_config = fdb_get_default_kvs_config();
    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" compact_test* > errorlog.txt");
        (void)r;

        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // insert documents
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta%d", i);
            sprintf(bodybuf, "body%d", i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }

        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == (uint64_t)n);

        // start deleting docs
        for (i=0;i<n;++i){
            fdb_del(db, doc[i]);
            if (i == n/2){
                // compact half-way
                thread_create(&tid, db_compact_during_doc_delete, (void *)dbfile);
            }
        }

        // join compactor
        thread_join(tid, &thread_ret);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // reopen
        fdb_kvs_close(db);
        fdb_close(dbfile);
        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // cleanup
        for (i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
        fdb_kvs_close(db);
        fdb_close(dbfile);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // compaction thread enters here //
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_close(dbfile);

    // shutdown
    thread_exit(0);
    return NULL;
}